

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS ref_part_metric(REF_NODE ref_node,char *filename)

{
  int iVar1;
  uint uVar2;
  int local_598;
  int local_584;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT dim;
  REF_BOOL csv_format;
  REF_BOOL solb_format;
  char line [1024];
  int local_7c;
  REF_INT status;
  REF_INT i;
  REF_INT ldim;
  REF_INT type;
  REF_INT ntype;
  REF_INT nnode;
  REF_BOOL found_keyword;
  REF_BOOL sol_format;
  size_t end_of_string;
  REF_INT local;
  REF_INT node;
  REF_GLOB global;
  REF_GLOB nnode_read;
  void *pvStack_38;
  REF_INT section_size;
  REF_DBL *metric;
  FILE *pFStack_28;
  REF_INT chunk;
  FILE *file;
  char *filename_local;
  REF_NODE ref_node_local;
  
  dim = 0;
  ref_private_macro_code_rss = 0;
  ref_private_macro_code_rss_1 = -1;
  file = (FILE *)filename;
  filename_local = (char *)ref_node;
  if (ref_node->ref_mpi->id == 0) {
    _found_keyword = strlen(filename);
    iVar1 = strcmp((char *)((long)file + (_found_keyword - 5)),".solb");
    if (iVar1 == 0) {
      dim = 1;
    }
  }
  ref_node_local._4_4_ = ref_mpi_all_or(*(REF_MPI *)(filename_local + 0x50),&dim);
  if (ref_node_local._4_4_ == 0) {
    if (dim == 0) {
      if (*(int *)(*(long *)(filename_local + 0x50) + 4) == 0) {
        _found_keyword = strlen((char *)file);
        iVar1 = strcmp((char *)((long)file + (_found_keyword - 4)),".csv");
        if (iVar1 == 0) {
          ref_private_macro_code_rss = 1;
        }
      }
      ref_node_local._4_4_ =
           ref_mpi_all_or(*(REF_MPI *)(filename_local + 0x50),&ref_private_macro_code_rss);
      if (ref_node_local._4_4_ == 0) {
        if (ref_private_macro_code_rss == 0) {
          pFStack_28 = (FILE *)0x0;
          nnode = 0;
          if (*(int *)(*(long *)(filename_local + 0x50) + 4) == 0) {
            pFStack_28 = fopen((char *)file,"r");
            if (pFStack_28 == (FILE *)0x0) {
              printf("unable to open %s\n",file);
            }
            if (pFStack_28 == (FILE *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x843,"ref_part_metric","unable to open file");
              return 2;
            }
            _found_keyword = strlen((char *)file);
            iVar1 = strcmp((char *)((long)file + (_found_keyword - 4)),".sol");
            if (iVar1 == 0) {
              nnode = 1;
              ntype = 0;
              ref_private_macro_code_rss_1 = -1;
              do {
                iVar1 = feof(pFStack_28);
                if ((iVar1 != 0) ||
                   (iVar1 = __isoc99_fscanf(pFStack_28,"%s",&csv_format), iVar1 == -1))
                goto LAB_001f599e;
                if ((long)iVar1 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x84d,"ref_part_metric","line read failed",1,(long)iVar1);
                  return 1;
                }
                iVar1 = strcmp("Dimension",(char *)&csv_format);
                if (iVar1 == 0) {
                  iVar1 = __isoc99_fscanf(pFStack_28,"%d",&ref_private_macro_code_rss_1);
                  if ((long)iVar1 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x850,"ref_part_metric","read dim",1,(long)iVar1);
                    return 1;
                  }
                }
                iVar1 = strcmp("SolAtVertices",(char *)&csv_format);
              } while (iVar1 != 0);
              iVar1 = __isoc99_fscanf(pFStack_28,"%d",&type);
              if ((long)iVar1 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x854,"ref_part_metric","read nnode",1,(long)iVar1);
                return 1;
              }
              if (*(long *)(filename_local + 0x68) != (long)type) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x856,"ref_part_metric","wrong vertex number in .sol",
                       *(long *)(filename_local + 0x68),(long)type);
                return 1;
              }
              iVar1 = __isoc99_fscanf(pFStack_28,"%d",&ldim);
              if ((long)iVar1 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x857,"ref_part_metric","read number of types",1,(long)iVar1);
                return 1;
              }
              status = 0;
              for (local_7c = 0; local_7c < ldim; local_7c = local_7c + 1) {
                iVar1 = __isoc99_fscanf(pFStack_28,"%d",&i);
                if ((long)iVar1 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x85a,"ref_part_metric","read number of types",1,(long)iVar1);
                  return 1;
                }
                if ((i < 1) || (3 < i)) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x85d,"ref_part_metric","only types 1 (scalar) or 3 (tensor)) supported");
                  printf(" %d type\n",(ulong)(uint)i);
                  return 1;
                }
                if (i == 1) {
                  status = status + 1;
                }
                if (i == 3) {
                  if (ref_private_macro_code_rss_1 == 2) {
                    status = status + 3;
                  }
                  else {
                    status = status + 6;
                  }
                }
              }
              if (ref_private_macro_code_rss_1 == 2) {
                if ((long)status != 3) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x868,"ref_part_metric","2D expects 3 terms of 2x2 metric",3,(long)status)
                  ;
                  return 1;
                }
              }
              else if ((long)status != 6) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x86a,"ref_part_metric","3D expects 6 terms of 3x3 metric",6,(long)status);
                return 1;
              }
              iVar1 = __isoc99_fscanf(pFStack_28,"%*[^1234567890-+.]");
              if (iVar1 < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x86c,"ref_part_metric","skip blank line");
                return 1;
              }
              ntype = 1;
LAB_001f599e:
              if (ref_private_macro_code_rss_1 == -1) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x871,"ref_part_metric","Dimension keyword missing from .sol metric");
                return 1;
              }
              if (ntype == 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x872,"ref_part_metric","SolAtVertices keyword missing from .sol metric");
                return 1;
              }
            }
            else {
              type = (REF_INT)*(undefined8 *)(filename_local + 0x68);
            }
          }
          uVar2 = ref_mpi_bcast(*(REF_MPI *)(filename_local + 0x50),&type,1,1);
          if (uVar2 == 0) {
            if (type / **(int **)(filename_local + 0x50) < 100000) {
              local_584 = 100000;
            }
            else {
              local_584 = type / **(int **)(filename_local + 0x50);
            }
            metric._4_4_ = type;
            if (local_584 < type) {
              metric._4_4_ = local_584;
            }
            if (metric._4_4_ * 6 < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x87d,"ref_part_metric","malloc metric of REF_DBL negative");
              ref_node_local._4_4_ = 1;
            }
            else {
              pvStack_38 = malloc((long)(metric._4_4_ * 6) << 3);
              if (pvStack_38 == (void *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x87d,"ref_part_metric","malloc metric of REF_DBL NULL");
                ref_node_local._4_4_ = 2;
              }
              else {
                for (ref_private_status_reis_ai_8._0_4_ = 0;
                    SBORROW4((int)ref_private_status_reis_ai_8,metric._4_4_ * 6) !=
                    (int)ref_private_status_reis_ai_8 + metric._4_4_ * -6 < 0;
                    ref_private_status_reis_ai_8._0_4_ = (int)ref_private_status_reis_ai_8 + 1) {
                  *(undefined8 *)((long)pvStack_38 + (long)(int)ref_private_status_reis_ai_8 * 8) =
                       0xbff0000000000000;
                }
                for (global = 0; global < type; global = nnode_read._4_4_ + global) {
                  if ((long)metric._4_4_ < *(long *)(filename_local + 0x68) - global) {
                    local_598 = metric._4_4_;
                  }
                  else {
                    local_598 = (int)*(undefined8 *)(filename_local + 0x68) - (int)global;
                  }
                  nnode_read._4_4_ = local_598;
                  if (*(int *)(*(long *)(filename_local + 0x50) + 4) == 0) {
                    for (end_of_string._4_4_ = 0; end_of_string._4_4_ < nnode_read._4_4_;
                        end_of_string._4_4_ = end_of_string._4_4_ + 1) {
                      if (nnode == 0) {
                        iVar1 = __isoc99_fscanf(pFStack_28,"%lf %lf %lf %lf %lf %lf",
                                                (void *)((long)pvStack_38 +
                                                        (long)(end_of_string._4_4_ * 6) * 8),
                                                (void *)((long)pvStack_38 +
                                                        (long)(end_of_string._4_4_ * 6 + 1) * 8),
                                                (void *)((long)pvStack_38 +
                                                        (long)(end_of_string._4_4_ * 6 + 2) * 8),
                                                (void *)((long)pvStack_38 +
                                                        (long)(end_of_string._4_4_ * 6 + 3) * 8),
                                                (void *)((long)pvStack_38 +
                                                        (long)(end_of_string._4_4_ * 6 + 4) * 8),
                                                (void *)((long)pvStack_38 +
                                                        (long)(end_of_string._4_4_ * 6 + 5) * 8));
                        if ((long)iVar1 != 6) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x89d,"ref_part_metric","metric read error",6,(long)iVar1);
                          return 1;
                        }
                      }
                      else if (ref_private_macro_code_rss_1 == 3) {
                        iVar1 = __isoc99_fscanf(pFStack_28,"%lf %lf %lf %lf %lf %lf",
                                                (void *)((long)pvStack_38 +
                                                        (long)(end_of_string._4_4_ * 6) * 8),
                                                (void *)((long)pvStack_38 +
                                                        (long)(end_of_string._4_4_ * 6 + 1) * 8),
                                                (void *)((long)pvStack_38 +
                                                        (long)(end_of_string._4_4_ * 6 + 3) * 8),
                                                (void *)((long)pvStack_38 +
                                                        (long)(end_of_string._4_4_ * 6 + 2) * 8),
                                                (void *)((long)pvStack_38 +
                                                        (long)(end_of_string._4_4_ * 6 + 4) * 8),
                                                (void *)((long)pvStack_38 +
                                                        (long)(end_of_string._4_4_ * 6 + 5) * 8));
                        if ((long)iVar1 != 6) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x88d,"ref_part_metric","metric read error",6,(long)iVar1);
                          return 1;
                        }
                      }
                      else {
                        iVar1 = __isoc99_fscanf(pFStack_28,"%lf %lf %lf",
                                                (void *)((long)pvStack_38 +
                                                        (long)(end_of_string._4_4_ * 6) * 8),
                                                (void *)((long)pvStack_38 +
                                                        (long)(end_of_string._4_4_ * 6 + 1) * 8),
                                                (void *)((long)pvStack_38 +
                                                        (long)(end_of_string._4_4_ * 6 + 3) * 8));
                        if ((long)iVar1 != 3) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x892,"ref_part_metric","metric read error",3,(long)iVar1);
                          return 1;
                        }
                        *(undefined8 *)((long)pvStack_38 + (long)(end_of_string._4_4_ * 6 + 2) * 8)
                             = 0;
                        *(undefined8 *)((long)pvStack_38 + (long)(end_of_string._4_4_ * 6 + 4) * 8)
                             = 0;
                        *(undefined8 *)((long)pvStack_38 + (long)(end_of_string._4_4_ * 6 + 5) * 8)
                             = 0x3ff0000000000000;
                      }
                    }
                    uVar2 = ref_mpi_bcast(*(REF_MPI *)(filename_local + 0x50),pvStack_38,
                                          metric._4_4_ * 6,3);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x8a1,"ref_part_metric",(ulong)uVar2,"bcast");
                      return uVar2;
                    }
                  }
                  else {
                    uVar2 = ref_mpi_bcast(*(REF_MPI *)(filename_local + 0x50),pvStack_38,
                                          metric._4_4_ * 6,3);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x8a5,"ref_part_metric",(ulong)uVar2,"bcast");
                      return uVar2;
                    }
                  }
                  for (end_of_string._4_4_ = 0; end_of_string._4_4_ < nnode_read._4_4_;
                      end_of_string._4_4_ = end_of_string._4_4_ + 1) {
                    _local = end_of_string._4_4_ + global;
                    uVar2 = ::ref_node_local((REF_NODE)filename_local,_local,
                                             (REF_INT *)&end_of_string);
                    if ((uVar2 != 0) && (uVar2 != 5)) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x8a9,"ref_part_metric",(ulong)uVar2,"local");
                      return uVar2;
                    }
                    if (((int)end_of_string != -1) &&
                       (uVar2 = ref_node_metric_set((REF_NODE)filename_local,(int)end_of_string,
                                                    (REF_DBL *)
                                                    ((long)pvStack_38 +
                                                    (long)(end_of_string._4_4_ * 6) * 8)),
                       uVar2 != 0)) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x8ac,"ref_part_metric",(ulong)uVar2,"set local node met");
                      return uVar2;
                    }
                  }
                }
                if (pvStack_38 != (void *)0x0) {
                  free(pvStack_38);
                }
                if (*(int *)(*(long *)(filename_local + 0x50) + 4) == 0) {
                  iVar1 = fclose(pFStack_28);
                  if ((long)iVar1 != 0) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x8b3,"ref_part_metric","close file",0,(long)iVar1);
                    return 1;
                  }
                }
                ref_node_local._4_4_ = 0;
              }
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x878,"ref_part_metric",(ulong)uVar2,"bcast nnode");
            ref_node_local._4_4_ = uVar2;
          }
        }
        else {
          ref_node_local._4_4_ = ref_part_metric_csv((REF_NODE)filename_local,(char *)file);
          if (ref_node_local._4_4_ == 0) {
            ref_node_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x83a,"ref_part_metric",(ulong)ref_node_local._4_4_,"part metric .csv");
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x837,"ref_part_metric",(ulong)ref_node_local._4_4_,"bcast");
      }
    }
    else {
      ref_node_local._4_4_ = ref_part_metric_solb((REF_NODE)filename_local,(char *)file);
      if (ref_node_local._4_4_ == 0) {
        ref_node_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x82e,"ref_part_metric",(ulong)ref_node_local._4_4_,"part metric .solb");
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x82b,
           "ref_part_metric",(ulong)ref_node_local._4_4_,"bcast");
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_part_metric(REF_NODE ref_node, const char *filename) {
  FILE *file;
  REF_INT chunk;
  REF_DBL *metric;
  REF_INT section_size;
  REF_GLOB nnode_read, global;
  REF_INT node, local;
  size_t end_of_string;
  REF_BOOL sol_format, found_keyword;
  REF_INT nnode, ntype, type;
  REF_INT ldim, i;
  REF_INT status;
  char line[1024];
  REF_BOOL solb_format = REF_FALSE;
  REF_BOOL csv_format = REF_FALSE;
  REF_INT dim = REF_EMPTY;

  if (ref_mpi_once(ref_node_mpi(ref_node))) {
    end_of_string = strlen(filename);
    if (strcmp(&filename[end_of_string - 5], ".solb") == 0)
      solb_format = REF_TRUE;
  }
  RSS(ref_mpi_all_or(ref_node_mpi(ref_node), &solb_format), "bcast");

  if (solb_format) {
    RSS(ref_part_metric_solb(ref_node, filename), "part metric .solb");
    return REF_SUCCESS;
  }

  if (ref_mpi_once(ref_node_mpi(ref_node))) {
    end_of_string = strlen(filename);
    if (strcmp(&filename[end_of_string - 4], ".csv") == 0)
      csv_format = REF_TRUE;
  }
  RSS(ref_mpi_all_or(ref_node_mpi(ref_node), &csv_format), "bcast");

  if (csv_format) {
    RSS(ref_part_metric_csv(ref_node, filename), "part metric .csv");
    return REF_SUCCESS;
  }

  file = NULL;
  sol_format = REF_FALSE;
  if (ref_mpi_once(ref_node_mpi(ref_node))) {
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    end_of_string = strlen(filename);
    if (strcmp(&filename[end_of_string - 4], ".sol") == 0) {
      sol_format = REF_TRUE;
      found_keyword = REF_FALSE;
      dim = REF_EMPTY;
      while (!feof(file)) {
        status = fscanf(file, "%s", line);
        if (EOF == status) break;
        REIS(1, status, "line read failed");

        if (0 == strcmp("Dimension", line)) {
          REIS(1, fscanf(file, "%d", &dim), "read dim");
        }

        if (0 == strcmp("SolAtVertices", line)) {
          REIS(1, fscanf(file, "%d", &nnode), "read nnode");
          REIS(ref_node_n_global(ref_node), nnode,
               "wrong vertex number in .sol");
          REIS(1, fscanf(file, "%d", &ntype), "read number of types");
          ldim = 0;
          for (i = 0; i < ntype; i++) {
            REIS(1, fscanf(file, "%d", &type), "read number of types");
            RAB(1 <= type && type <= 3,
                "only types 1 (scalar) or 3 (tensor)) supported",
                { printf(" %d type\n", type); });
            if (1 == type) ldim += 1;
            if (3 == type) {
              if (2 == dim) {
                ldim += 3;
              } else {
                ldim += 6;
              }
            }
          }
          if (2 == dim) {
            REIS(3, ldim, "2D expects 3 terms of 2x2 metric");
          } else {
            REIS(6, ldim, "3D expects 6 terms of 3x3 metric");
          }
          RAS(0 <= fscanf(file, "%*[^1234567890-+.]"), "skip blank line");
          found_keyword = REF_TRUE;
          break;
        }
      }
      RUS(REF_EMPTY, dim, "Dimension keyword missing from .sol metric");
      RAS(found_keyword, "SolAtVertices keyword missing from .sol metric");
    } else {
      nnode = (REF_INT)ref_node_n_global(ref_node);
    }
  }
  RSS(ref_mpi_bcast(ref_node_mpi(ref_node), &nnode, 1, REF_INT_TYPE),
      "bcast nnode");

  chunk = (REF_INT)MAX(100000, nnode / ref_mpi_n(ref_node_mpi(ref_node)));
  chunk = (REF_INT)MIN((REF_GLOB)chunk, nnode);

  ref_malloc_init(metric, 6 * chunk, REF_DBL, -1.0);

  nnode_read = 0;
  while (nnode_read < nnode) {
    section_size =
        (REF_INT)MIN((REF_GLOB)chunk, ref_node_n_global(ref_node) - nnode_read);
    if (ref_mpi_once(ref_node_mpi(ref_node))) {
      for (node = 0; node < section_size; node++)
        if (sol_format) {
          if (3 == dim) {
            REIS(6,
                 fscanf(file, "%lf %lf %lf %lf %lf %lf",
                        &(metric[0 + 6 * node]), &(metric[1 + 6 * node]),
                        &(metric[3 + 6 * node]), /* transposed 3,2 */
                        &(metric[2 + 6 * node]), &(metric[4 + 6 * node]),
                        &(metric[5 + 6 * node])),
                 "metric read error");
          } else {
            REIS(3,
                 fscanf(file, "%lf %lf %lf", &(metric[0 + 6 * node]),
                        &(metric[1 + 6 * node]), &(metric[3 + 6 * node])),
                 "metric read error");
            metric[2 + 6 * node] = 0.0; /* m13 */
            metric[4 + 6 * node] = 0.0; /* m23 */
            metric[5 + 6 * node] = 1.0; /* m33 */
          }
        } else {
          REIS(6,
               fscanf(file, "%lf %lf %lf %lf %lf %lf", &(metric[0 + 6 * node]),
                      &(metric[1 + 6 * node]), &(metric[2 + 6 * node]),
                      &(metric[3 + 6 * node]), &(metric[4 + 6 * node]),
                      &(metric[5 + 6 * node])),
               "metric read error");
        }
      RSS(ref_mpi_bcast(ref_node_mpi(ref_node), metric, 6 * chunk,
                        REF_DBL_TYPE),
          "bcast");
    } else {
      RSS(ref_mpi_bcast(ref_node_mpi(ref_node), metric, 6 * chunk,
                        REF_DBL_TYPE),
          "bcast");
    }
    for (node = 0; node < section_size; node++) {
      global = node + nnode_read;
      RXS(ref_node_local(ref_node, global, &local), REF_NOT_FOUND, "local");
      if (REF_EMPTY != local) {
        RSS(ref_node_metric_set(ref_node, local, &(metric[6 * node])),
            "set local node met");
      }
    }
    nnode_read += section_size;
  }

  ref_free(metric);
  if (ref_mpi_once(ref_node_mpi(ref_node))) REIS(0, fclose(file), "close file");

  return REF_SUCCESS;
}